

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  QDebug *pQVar6;
  int *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)r);
  *(undefined1 *)(*(long *)r + 0x30) = 0;
  pQVar6 = QDebug::operator<<((QDebug *)r,"QRect");
  QDebug::operator<<(pQVar6,'(');
  pQVar6 = QDebug::operator<<((QDebug *)r,*in_RDX);
  pQVar6 = QDebug::operator<<(pQVar6,',');
  pQVar6 = QDebug::operator<<(pQVar6,in_RDX[1]);
  QDebug::operator<<(pQVar6,' ');
  iVar1 = in_RDX[2];
  iVar2 = *in_RDX;
  iVar3 = in_RDX[3];
  iVar4 = in_RDX[1];
  pQVar6 = QDebug::operator<<((QDebug *)r,((long)iVar1 - (long)iVar2) + 1);
  pQVar6 = QDebug::operator<<(pQVar6,'x');
  QDebug::operator<<(pQVar6,((long)iVar3 - (long)iVar4) + 1);
  if (0x7ffffffe < (long)iVar3 - (long)iVar4 || 0x7ffffffe < (long)iVar1 - (long)iVar2) {
    QDebug::operator<<((QDebug *)r," (oversized)");
  }
  QDebug::operator<<((QDebug *)r,')');
  r->x1 = 0;
  r->y1 = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = *(_func_int ***)r;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRect &r)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QRect" << '(';
    QtDebugUtils::formatQRect(dbg, r);
    dbg << ')';
    return dbg;
}